

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

pool_ptr<soul::AST::Expression> __thiscall
soul::StructuralParser::tryParsingType(StructuralParser *this,ParseTypeContext parseContext)

{
  bool bVar1;
  Op op;
  ConcreteType *pCVar2;
  QualifiedIdentifier *qi_00;
  TypeMetaFunction *pTVar3;
  Expression *pEVar4;
  ParseTypeContext in_EDX;
  char (*args) [25];
  undefined4 in_register_00000034;
  StructuralParser *this_00;
  Op metaTypeOp;
  QualifiedIdentifier *qi;
  CompileMessage local_260;
  char *local_228;
  Op local_21c;
  Expression *local_218;
  Expression *type;
  char *local_1d8;
  Type local_1d0;
  char *local_1b8;
  Type local_1b0;
  char *local_198;
  Type local_190;
  char *local_178;
  Type local_170;
  char *local_158;
  Type local_150;
  char *local_138;
  Type local_130;
  char *local_118;
  Type local_110;
  char *local_f8;
  Type local_f0;
  char *local_d8;
  Type local_d0;
  char *local_b8;
  Type local_b0;
  char *local_98;
  Type local_90;
  char *local_78;
  undefined4 local_6c;
  Type local_68;
  char *local_40;
  undefined1 local_38 [8];
  Context context;
  ParseTypeContext parseContext_local;
  StructuralParser *this_local;
  
  this_00 = (StructuralParser *)CONCAT44(in_register_00000034,parseContext);
  context.parentScope._4_4_ = in_EDX;
  getContext((Context *)local_38,this_00);
  local_40 = "float";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)this_00,(TokenType)"float");
  if (bVar1) {
    Type::Type(&local_68,float32);
    pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_68);
    pEVar4 = parseVectorOrArrayTypeSuffixes
                       (this_00,&pCVar2->super_Expression,context.parentScope._4_4_);
    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
              ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
    Type::~Type(&local_68);
  }
  else {
    local_78 = "float32";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        *)this_00,(TokenType)0x4ae996);
    if (bVar1) {
      Type::Type(&local_90,float32);
      pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_90);
      pEVar4 = parseVectorOrArrayTypeSuffixes
                         (this_00,&pCVar2->super_Expression,context.parentScope._4_4_);
      pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
      Type::~Type(&local_90);
    }
    else {
      local_98 = "float64";
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          *)this_00,(TokenType)0x4ae9ad);
      if (bVar1) {
        Type::Type(&local_b0,float64);
        pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_b0);
        pEVar4 = parseVectorOrArrayTypeSuffixes
                           (this_00,&pCVar2->super_Expression,context.parentScope._4_4_);
        pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                  ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
        Type::~Type(&local_b0);
      }
      else {
        local_b8 = "void";
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>
                          ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            *)this_00,(TokenType)0x4ae901);
        if (bVar1) {
          Type::Type(&local_d0,void_);
          pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_d0);
          pEVar4 = parseVectorOrArrayTypeSuffixes
                             (this_00,&pCVar2->super_Expression,context.parentScope._4_4_);
          pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                    ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
          Type::~Type(&local_d0);
        }
        else {
          local_d8 = "int";
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>
                            ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                              *)this_00,(TokenType)0x4d15f0);
          if (bVar1) {
            Type::Type(&local_f0,int32);
            pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_f0);
            pEVar4 = parseVectorOrArrayTypeSuffixes
                               (this_00,&pCVar2->super_Expression,context.parentScope._4_4_);
            pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                      ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
            Type::~Type(&local_f0);
          }
          else {
            local_f8 = "int32";
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>
                              ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                *)this_00,(TokenType)0x4ae96b);
            if (bVar1) {
              Type::Type(&local_110,int32);
              pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_110);
              pEVar4 = parseVectorOrArrayTypeSuffixes
                                 (this_00,&pCVar2->super_Expression,context.parentScope._4_4_);
              pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                        ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
              Type::~Type(&local_110);
            }
            else {
              local_118 = "int64";
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matchIf<soul::TokenType>
                                ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                  *)this_00,(TokenType)0x4ae981);
              if (bVar1) {
                Type::Type(&local_130,int64);
                pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_130);
                pEVar4 = parseVectorOrArrayTypeSuffixes
                                   (this_00,&pCVar2->super_Expression,context.parentScope._4_4_);
                pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                          ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
                Type::~Type(&local_130);
              }
              else {
                local_138 = "bool";
                bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        ::matchIf<soul::TokenType>
                                  ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                    *)this_00,(TokenType)0x4ae9c4);
                if (bVar1) {
                  Type::Type(&local_150,bool_);
                  pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_150);
                  pEVar4 = parseVectorOrArrayTypeSuffixes
                                     (this_00,&pCVar2->super_Expression,context.parentScope._4_4_);
                  pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                            ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
                  Type::~Type(&local_150);
                }
                else {
                  local_158 = "complex";
                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          ::matchIf<soul::TokenType>
                                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                      *)this_00,(TokenType)0x4ade85);
                  if (bVar1) {
                    Type::Type(&local_170,complex32);
                    pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_170);
                    pEVar4 = parseVectorOrArrayTypeSuffixes
                                       (this_00,&pCVar2->super_Expression,context.parentScope._4_4_)
                    ;
                    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                              ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
                    Type::~Type(&local_170);
                  }
                  else {
                    local_178 = "complex32";
                    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            ::matchIf<soul::TokenType>
                                      ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                        *)this_00,(TokenType)"complex32");
                    if (bVar1) {
                      Type::Type(&local_190,complex32);
                      pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_190);
                      pEVar4 = parseVectorOrArrayTypeSuffixes
                                         (this_00,&pCVar2->super_Expression,
                                          context.parentScope._4_4_);
                      pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                                ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
                      Type::~Type(&local_190);
                    }
                    else {
                      local_198 = "complex64";
                      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                              ::matchIf<soul::TokenType>
                                        ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                          *)this_00,(TokenType)"complex64");
                      if (bVar1) {
                        Type::Type(&local_1b0,complex64);
                        pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_1b0);
                        pEVar4 = parseVectorOrArrayTypeSuffixes
                                           (this_00,&pCVar2->super_Expression,
                                            context.parentScope._4_4_);
                        pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                                  ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
                        Type::~Type(&local_1b0);
                      }
                      else {
                        local_1b8 = "string";
                        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                ::matchIf<soul::TokenType>
                                          ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                            *)this_00,(TokenType)0x4ae9f6);
                        if (bVar1) {
                          Type::createStringLiteral();
                          pCVar2 = createConcreteType(this_00,(Context *)local_38,&local_1d0);
                          pEVar4 = parseArrayTypeSuffixes
                                             (this_00,&pCVar2->super_Expression,
                                              context.parentScope._4_4_);
                          pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
                                    ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
                          Type::~Type(&local_1d0);
                        }
                        else {
                          local_1d8 = "const";
                          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                  ::matchIf<soul::TokenType>
                                            ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                              *)this_00,(TokenType)0x4d002e);
                          if (bVar1) {
                            if (context.parentScope._4_4_ == structMember) {
                              Errors::memberCannotBeConst<>();
                              (*(this_00->super_SOULTokeniser)._vptr_Tokeniser[2])(this_00,&type);
                              CompileMessage::~CompileMessage((CompileMessage *)&type);
                            }
                            local_218 = parseType(this_00,context.parentScope._4_4_);
                            local_21c = makeConst;
                            pTVar3 = allocate<soul::AST::TypeMetaFunction,soul::AST::Context&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op>
                                               (this_00,(Context *)local_38,local_218,&local_21c);
                            pool_ptr<soul::AST::Expression>::
                            pool_ptr<soul::AST::TypeMetaFunction,void>
                                      ((pool_ptr<soul::AST::Expression> *)this,pTVar3);
                          }
                          else {
                            local_228 = "fixed";
                            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                    ::matchIf<soul::TokenType>
                                              ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                *)this_00,(TokenType)"fixed");
                            if (bVar1) {
                              Errors::notYetImplemented<char_const(&)[25]>
                                        (&local_260,(Errors *)"Fixed point type support",args);
                              AST::Context::throwError((Context *)local_38,&local_260,false);
                            }
                            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                    ::matches((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                               *)this_00,(TokenType)"$identifier");
                            if (bVar1) {
                              qi_00 = parseQualifiedIdentifier(this_00);
                              op = getOpForTypeMetaFunctionName(qi_00);
                              if ((op == none) ||
                                 (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                          ::matches((
                                                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                                                  *)this_00,(TokenType)0x4d4496), !bVar1)) {
                                pEVar4 = parseVectorOrArrayTypeSuffixes
                                                   (this_00,&qi_00->super_Expression,
                                                    context.parentScope._4_4_);
                                pool_ptr<soul::AST::Expression>::
                                pool_ptr<soul::AST::Expression,void>
                                          ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
                              }
                              else {
                                pTVar3 = parseTypeMetaFunction(this_00,(Context *)local_38,op);
                                pEVar4 = parseVectorOrArrayTypeSuffixes
                                                   (this_00,&pTVar3->super_Expression,
                                                    context.parentScope._4_4_);
                                pool_ptr<soul::AST::Expression>::
                                pool_ptr<soul::AST::Expression,void>
                                          ((pool_ptr<soul::AST::Expression> *)this,pEVar4);
                              }
                            }
                            else {
                              pool_ptr<soul::AST::Expression>::pool_ptr
                                        ((pool_ptr<soul::AST::Expression> *)this);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_6c = 1;
  AST::Context::~Context((Context *)local_38);
  return (pool_ptr<soul::AST::Expression>)(Expression *)this;
}

Assistant:

pool_ptr<AST::Expression> tryParsingType (ParseTypeContext parseContext)
    {
        auto context = getContext();

        if (matchIf (Keyword::float_))    return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::float32),  parseContext);
        if (matchIf (Keyword::float32))   return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::float32),  parseContext);
        if (matchIf (Keyword::float64))   return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::float64),  parseContext);
        if (matchIf (Keyword::void_))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::void_),    parseContext);
        if (matchIf (Keyword::int_))      return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::int32),    parseContext);
        if (matchIf (Keyword::int32))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::int32),    parseContext);
        if (matchIf (Keyword::int64))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::int64),    parseContext);
        if (matchIf (Keyword::bool_))     return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::bool_),    parseContext);
        if (matchIf (Keyword::complex))   return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::complex32),  parseContext);
        if (matchIf (Keyword::complex32)) return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::complex32),  parseContext);
        if (matchIf (Keyword::complex64)) return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::complex64),  parseContext);
        if (matchIf (Keyword::string))    return parseArrayTypeSuffixes (createConcreteType (context, Type::createStringLiteral()), parseContext);

        if (matchIf (Keyword::const_))
        {
            if (parseContext == ParseTypeContext::structMember)
                throwError (Errors::memberCannotBeConst());

            auto& type = parseType (parseContext);
            return allocate<AST::TypeMetaFunction> (context, type, AST::TypeMetaFunction::Op::makeConst);
        }

        if (matchIf (Keyword::fixed))
        {
            context.throwError (Errors::notYetImplemented ("Fixed point type support"));
            return parseVectorOrArrayTypeSuffixes (createConcreteType (context, PrimitiveType::fixed), parseContext);
        }

        if (matches (Token::identifier))
        {
            auto& qi = parseQualifiedIdentifier();
            auto metaTypeOp = getOpForTypeMetaFunctionName (qi);

            if (metaTypeOp != AST::TypeMetaFunction::Op::none && matches (Operator::openParen))
                return parseVectorOrArrayTypeSuffixes (parseTypeMetaFunction (context, metaTypeOp), parseContext);

            return parseVectorOrArrayTypeSuffixes (qi, parseContext);
        }

        return {};
    }